

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_boundary_manifold(REF_GRID ref_grid)

{
  uint uVar1;
  int iVar2;
  REF_CELL ref_cell;
  REF_NODE pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  uint uVar6;
  int cell;
  long lVar7;
  ulong uVar8;
  long lVar9;
  REF_INT ncell;
  REF_NODE local_150;
  REF_INT cell_list [10];
  REF_INT ns [27];
  REF_INT nodes [27];
  
  local_150 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  cell = 0;
  do {
    if (ref_cell->max <= cell) {
      return 0;
    }
    RVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (RVar4 == 0) {
      for (lVar9 = 0; lVar9 < ref_cell->edge_per; lVar9 = lVar9 + 1) {
        lVar7 = (long)ref_cell->size_per * (long)cell;
        uVar1 = ref_cell->c2n[ref_cell->e2n[lVar9 * 2] + lVar7];
        uVar6 = ref_cell->c2n[(long)(int)lVar7 + (long)ref_cell->e2n[lVar9 * 2 + 1]];
        iVar2 = local_150->ref_mpi->id;
        if ((iVar2 == local_150->part[(int)uVar1]) || (iVar2 == local_150->part[(int)uVar6])) {
          uVar5 = ref_cell_list_with2(ref_cell,uVar1,uVar6,10,&ncell,cell_list);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x97,"ref_validation_boundary_manifold",(ulong)uVar5,
                   "more than ten triangles found with two nodes");
            printf("nodes %d %d faceid %d\n",(ulong)uVar1,(ulong)uVar6,(ulong)(uint)nodes[3]);
            pRVar3 = local_150;
            ref_node_location(local_150,uVar1);
            ref_node_location(pRVar3,uVar6);
            return uVar5;
          }
          lVar7 = (long)ncell;
          if (lVar7 != 2) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0xa2,"ref_validation_boundary_manifold","two triangles expected",2,lVar7);
            printf("nodes %d %d faceid %d\n",(ulong)uVar1,(ulong)uVar6,(ulong)(uint)nodes[3]);
            pRVar3 = local_150;
            ref_node_location(local_150,uVar1);
            ref_node_location(pRVar3,uVar6);
            uVar8 = 0;
            while( true ) {
              if ((long)ncell <= (long)uVar8) {
                return 1;
              }
              uVar1 = cell_list[uVar8];
              uVar6 = ref_cell_nodes(ref_cell,uVar1,ns);
              if (uVar6 != 0) break;
              lVar7 = CONCAT44((int)((ulong)lVar7 >> 0x20),ns[3]);
              printf(" item %d cell %d nodes %d %d %d id %d\n",uVar8 & 0xffffffff,(ulong)uVar1,
                     (ulong)(uint)ns[0],(ulong)(uint)ns[1],(ulong)(uint)ns[2],lVar7);
              uVar8 = uVar8 + 1;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x9e,"ref_validation_boundary_manifold",(ulong)uVar6,"get cell",lVar7);
            return uVar6;
          }
        }
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_manifold(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, c, ns[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1, ncell, cell_list[10];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
        continue;
      RSB(ref_cell_list_with2(ref_cell, node0, node1, 10, &ncell, cell_list),
          "more than ten triangles found with two nodes", {
            printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
            ref_node_location(ref_node, node0);
            ref_node_location(ref_node, node1);
          });
      REIB(2, ncell, "two triangles expected", {
        printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
        ref_node_location(ref_node, node0);
        ref_node_location(ref_node, node1);
        for (i = 0; i < ncell; i++) {
          c = cell_list[i];
          RSS(ref_cell_nodes(ref_cell, c, ns), "get cell");
          printf(" item %d cell %d nodes %d %d %d id %d\n", i, c, ns[0], ns[1],
                 ns[2], ns[3]);
        }
      });
    }
  }

  return REF_SUCCESS;
}